

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUnreach.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkConstructExdc(DdManager *dd,Abc_Ntk_t *pNtk,DdNode *bUnreach)

{
  int iVar1;
  DdNode *pDVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  int *Permute;
  Abc_Obj_t *pAVar6;
  int local_4c;
  int i;
  int *pPermute;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtkNew;
  DdNode *bUnreach_local;
  Abc_Ntk_t *pNtk_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_BDD,1);
  pDVar2 = (DdNode *)Extra_UtilStrsav("exdc");
  (dd_local->sentinel).next = pDVar2;
  (dd_local->sentinel).type.value = 0.0;
  for (local_4c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar3 = Abc_NtkBox(pNtk,local_4c);
    iVar1 = Abc_ObjIsLatch(pAVar3);
    if (iVar1 != 0) {
      pAVar3 = Abc_NtkBox(pNtk,local_4c);
      pAVar3 = Abc_ObjFanout0(pAVar3);
      pAVar4 = Abc_NtkCreatePi((Abc_Ntk_t *)dd_local);
      (pAVar3->field_6).pCopy = pAVar4;
      pcVar5 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar4,pcVar5,(char *)0x0);
    }
  }
  pAVar3 = Abc_NtkCreateNode((Abc_Ntk_t *)dd_local);
  for (local_4c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar4 = Abc_NtkBox(pNtk,local_4c);
    iVar1 = Abc_ObjIsLatch(pAVar4);
    if (iVar1 != 0) {
      pAVar4 = Abc_NtkBox(pNtk,local_4c);
      pAVar4 = Abc_ObjFanout0(pAVar4);
      Abc_ObjAddFanin(pAVar3,(pAVar4->field_6).pCopy);
    }
  }
  Permute = (int *)malloc((long)dd->size << 2);
  for (local_4c = 0; local_4c < dd->size; local_4c = local_4c + 1) {
    Permute[local_4c] = -1;
  }
  for (local_4c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar4 = Abc_NtkBox(pNtk,local_4c);
    iVar1 = Abc_ObjIsLatch(pAVar4);
    if (iVar1 != 0) {
      iVar1 = Abc_NtkPiNum(pNtk);
      Permute[iVar1 + local_4c] = local_4c;
    }
  }
  pDVar2 = Extra_TransferPermute(dd,(DdManager *)dd_local->gcFrac,bUnreach,Permute);
  (pAVar3->field_5).pData = pDVar2;
  Cudd_Ref((DdNode *)(pAVar3->field_5).pData);
  if (Permute != (int *)0x0) {
    free(Permute);
  }
  Abc_NodeMinimumBase(pAVar3);
  for (local_4c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar4 = Abc_NtkPo(pNtk,local_4c);
    pAVar6 = Abc_ObjFanin0(pAVar4);
    iVar1 = Abc_ObjIsCi(pAVar6);
    if (iVar1 == 0) {
      pAVar6 = Abc_NtkCreatePo((Abc_Ntk_t *)dd_local);
      (pAVar4->field_6).pCopy = pAVar6;
      pcVar5 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar6,pcVar5,(char *)0x0);
    }
  }
  for (local_4c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar4 = Abc_NtkBox(pNtk,local_4c);
    iVar1 = Abc_ObjIsLatch(pAVar4);
    if (iVar1 != 0) {
      pAVar4 = Abc_NtkBox(pNtk,local_4c);
      pAVar4 = Abc_ObjFanin0(pAVar4);
      pAVar6 = Abc_NtkCreatePo((Abc_Ntk_t *)dd_local);
      (pAVar4->field_6).pCopy = pAVar6;
      pcVar5 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar6,pcVar5,(char *)0x0);
    }
  }
  for (local_4c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar4 = Abc_NtkPo(pNtk,local_4c);
    pAVar6 = Abc_ObjFanin0(pAVar4);
    iVar1 = Abc_ObjIsCi(pAVar6);
    if (iVar1 == 0) {
      Abc_ObjAddFanin((pAVar4->field_6).pCopy,pAVar3);
    }
  }
  for (local_4c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar4 = Abc_NtkBox(pNtk,local_4c);
    iVar1 = Abc_ObjIsLatch(pAVar4);
    if (iVar1 != 0) {
      pAVar4 = Abc_NtkBox(pNtk,local_4c);
      pAVar4 = Abc_ObjFanin0(pAVar4);
      Abc_ObjAddFanin((pAVar4->field_6).pCopy,pAVar3);
    }
  }
  Abc_AigCleanup((Abc_Aig_t *)dd_local->gcFrac);
  Abc_NtkLogicMakeSimpleCos((Abc_Ntk_t *)dd_local,0);
  iVar1 = Abc_NtkBddToSop((Abc_Ntk_t *)dd_local,-1,1000000000);
  if (iVar1 == 0) {
    printf("Abc_NtkConstructExdc(): Converting to SOPs has failed.\n");
    dd_local = (DdManager *)0x0;
  }
  return (Abc_Ntk_t *)dd_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkConstructExdc( DdManager * dd, Abc_Ntk_t * pNtk, DdNode * bUnreach )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode, * pNodeNew;
    int * pPermute;
    int i;

    // start the new network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_BDD, 1 );
    pNtkNew->pName = Extra_UtilStrsav( "exdc" );
    pNtkNew->pSpec = NULL;

    // create PIs corresponding to LOs
    Abc_NtkForEachLatchOutput( pNtk, pNode, i )
        Abc_ObjAssignName( pNode->pCopy = Abc_NtkCreatePi(pNtkNew), Abc_ObjName(pNode), NULL );
    // cannot ADD POs here because pLatch->pCopy point to the PIs

    // create a new node
    pNodeNew = Abc_NtkCreateNode(pNtkNew);
    // add the fanins corresponding to latch outputs
    Abc_NtkForEachLatchOutput( pNtk, pNode, i )
        Abc_ObjAddFanin( pNodeNew, pNode->pCopy );

    // create the logic function
    pPermute = ABC_ALLOC( int, dd->size );
    for ( i = 0; i < dd->size; i++ )
        pPermute[i] = -1;
    Abc_NtkForEachLatch( pNtk, pNode, i )
        pPermute[Abc_NtkPiNum(pNtk) + i] = i;
    // remap the functions
    pNodeNew->pData = Extra_TransferPermute( dd, (DdManager *)pNtkNew->pManFunc, bUnreach, pPermute );   Cudd_Ref( (DdNode *)pNodeNew->pData );
    ABC_FREE( pPermute );
    Abc_NodeMinimumBase( pNodeNew );

    // for each CO, create PO (skip POs equal to CIs because of name conflict)
    Abc_NtkForEachPo( pNtk, pNode, i )
        if ( !Abc_ObjIsCi(Abc_ObjFanin0(pNode)) )
            Abc_ObjAssignName( pNode->pCopy = Abc_NtkCreatePo(pNtkNew), Abc_ObjName(pNode), NULL );
    Abc_NtkForEachLatchInput( pNtk, pNode, i )
        Abc_ObjAssignName( pNode->pCopy = Abc_NtkCreatePo(pNtkNew), Abc_ObjName(pNode), NULL );

    // link to the POs of the network 
    Abc_NtkForEachPo( pNtk, pNode, i )
        if ( !Abc_ObjIsCi(Abc_ObjFanin0(pNode)) )
            Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    Abc_NtkForEachLatchInput( pNtk, pNode, i )
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );

    // remove the extra nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );

    // fix the problem with complemented and duplicated CO edges
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );

    // transform the network to the SOP representation
    if ( !Abc_NtkBddToSop( pNtkNew, -1, ABC_INFINITY ) )
    {
        printf( "Abc_NtkConstructExdc(): Converting to SOPs has failed.\n" );
        return NULL;
    }
    return pNtkNew;
//    return NULL;
}